

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O2

void Hacl_Bignum256_32_sqr(uint32_t *a,uint32_t *res)

{
  uint uVar1;
  ulong uVar2;
  uint32_t *res_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t *res_j;
  ulong uVar6;
  ulong uVar7;
  uint32_t *ab;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  
  res[0xc] = 0;
  res[0xd] = 0;
  res[0xe] = 0;
  res[0xf] = 0;
  res[8] = 0;
  res[9] = 0;
  res[10] = 0;
  res[0xb] = 0;
  res[4] = 0;
  res[5] = 0;
  res[6] = 0;
  res[7] = 0;
  res[0] = 0;
  res[1] = 0;
  res[2] = 0;
  res[3] = 0;
  *(ulong *)(res + 1) = (ulong)*a * (ulong)a[1];
  uVar1 = a[2];
  uVar2 = 0;
  for (lVar3 = 2; lVar3 != 4; lVar3 = lVar3 + 1) {
    uVar2 = uVar2 + res[lVar3] + (ulong)a[lVar3 + -2] * (ulong)uVar1;
    res[lVar3] = (uint32_t)uVar2;
    uVar2 = uVar2 >> 0x20;
  }
  res[4] = (uint32_t)uVar2;
  uVar1 = a[3];
  uVar2 = 0;
  for (lVar3 = 3; lVar3 != 6; lVar3 = lVar3 + 1) {
    uVar2 = uVar2 + res[lVar3] + (ulong)a[lVar3 + -3] * (ulong)uVar1;
    res[lVar3] = (uint32_t)uVar2;
    uVar2 = uVar2 >> 0x20;
  }
  res[6] = (uint32_t)uVar2;
  uVar5 = (ulong)a[4];
  uVar6 = *a * uVar5 + (ulong)res[4];
  res[4] = (uint32_t)uVar6;
  uVar4 = a[1] * uVar5 + (ulong)res[5] + (uVar6 >> 0x20);
  res[5] = (uint32_t)uVar4;
  uVar2 = uVar2 + a[2] * uVar5 + (uVar4 >> 0x20);
  res[6] = (uint32_t)uVar2;
  uVar5 = a[3] * uVar5 + (ulong)res[7] + (uVar2 >> 0x20);
  *(ulong *)(res + 7) = uVar5;
  uVar6 = (ulong)a[5];
  uVar4 = (uVar4 & 0xffffffff) + *a * uVar6;
  res[5] = (uint32_t)uVar4;
  uVar2 = (uVar2 & 0xffffffff) + a[1] * uVar6 + (uVar4 >> 0x20);
  res[6] = (uint32_t)uVar2;
  uVar4 = (uVar5 & 0xffffffff) + a[2] * uVar6 + (uVar2 >> 0x20);
  res[7] = (uint32_t)uVar4;
  uVar5 = a[3] * uVar6 + (uVar5 >> 0x20) + (uVar4 >> 0x20);
  res[8] = (uint32_t)uVar5;
  uVar7 = a[4] * uVar6 + (ulong)res[9] + (uVar5 >> 0x20);
  *(ulong *)(res + 9) = uVar7;
  uVar6 = (ulong)a[6];
  uVar2 = (uVar2 & 0xffffffff) + *a * uVar6;
  res[6] = (uint32_t)uVar2;
  uVar2 = (uVar4 & 0xffffffff) + a[1] * uVar6 + (uVar2 >> 0x20);
  res[7] = (uint32_t)uVar2;
  uVar2 = (uVar5 & 0xffffffff) + a[2] * uVar6 + (uVar2 >> 0x20);
  res[8] = (uint32_t)uVar2;
  uVar2 = (uVar7 & 0xffffffff) + a[3] * uVar6 + (uVar2 >> 0x20);
  res[9] = (uint32_t)uVar2;
  for (lVar3 = 10; lVar3 != 0xc; lVar3 = lVar3 + 1) {
    uVar2 = (uVar2 >> 0x20) + (ulong)res[lVar3] + a[lVar3 + -6] * uVar6;
    res[lVar3] = (uint32_t)uVar2;
  }
  res[0xc] = (uint32_t)(uVar2 >> 0x20);
  uVar2 = (ulong)a[7];
  uVar5 = *a * uVar2 + (ulong)res[7];
  res[7] = (uint32_t)uVar5;
  uVar5 = a[1] * uVar2 + (ulong)res[8] + (uVar5 >> 0x20);
  res[8] = (uint32_t)uVar5;
  uVar5 = a[2] * uVar2 + (ulong)res[9] + (uVar5 >> 0x20);
  res[9] = (uint32_t)uVar5;
  uVar5 = a[3] * uVar2 + (ulong)res[10] + (uVar5 >> 0x20);
  res[10] = (uint32_t)uVar5;
  for (lVar3 = 0xb; res_00 = (uint32_t *)(uVar5 >> 0x20), lVar3 != 0xe; lVar3 = lVar3 + 1) {
    uVar5 = (long)res_00 + a[lVar3 + -7] * uVar2 + (ulong)res[lVar3];
    res[lVar3] = (uint32_t)uVar5;
  }
  res[0xe] = (uint32_t)(uVar5 >> 0x20);
  Hacl_Bignum_Addition_bn_add_eq_len_u32((uint32_t)res,res,res,res_00);
  local_58 = (ulong)*a * (ulong)*a;
  local_50 = (ulong)a[1] * (ulong)a[1];
  local_48 = (ulong)a[2] * (ulong)a[2];
  local_40 = (ulong)a[3] * (ulong)a[3];
  local_38 = (ulong)a[4] * (ulong)a[4];
  local_30 = (ulong)a[5] * (ulong)a[5];
  local_28 = (ulong)a[6] * (ulong)a[6];
  local_20 = (ulong)a[7] * (ulong)a[7];
  Hacl_Bignum_Addition_bn_add_eq_len_u32((uint32_t)res,(uint32_t *)&local_58,res,res_00);
  return;
}

Assistant:

void Hacl_Bignum256_32_sqr(uint32_t *a, uint32_t *res)
{
  memset(res, 0U, 16U * sizeof (uint32_t));
  KRML_MAYBE_FOR8(i0,
    0U,
    8U,
    1U,
    uint32_t *ab = a;
    uint32_t a_j = a[i0];
    uint32_t *res_j = res + i0;
    uint32_t c = 0U;
    for (uint32_t i = 0U; i < i0 / 4U; i++)
    {
      uint32_t a_i = ab[4U * i];
      uint32_t *res_i0 = res_j + 4U * i;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, a_j, c, res_i0);
      uint32_t a_i0 = ab[4U * i + 1U];
      uint32_t *res_i1 = res_j + 4U * i + 1U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, a_j, c, res_i1);
      uint32_t a_i1 = ab[4U * i + 2U];
      uint32_t *res_i2 = res_j + 4U * i + 2U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, a_j, c, res_i2);
      uint32_t a_i2 = ab[4U * i + 3U];
      uint32_t *res_i = res_j + 4U * i + 3U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, a_j, c, res_i);
    }
    for (uint32_t i = i0 / 4U * 4U; i < i0; i++)
    {
      uint32_t a_i = ab[i];
      uint32_t *res_i = res_j + i;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, a_j, c, res_i);
    }
    uint32_t r = c;
    res[i0 + i0] = r;);
  uint32_t c0 = Hacl_Bignum_Addition_bn_add_eq_len_u32(16U, res, res, res);
  KRML_MAYBE_UNUSED_VAR(c0);
  uint32_t tmp[16U] = { 0U };
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint64_t res1 = (uint64_t)a[i] * (uint64_t)a[i];
    uint32_t hi = (uint32_t)(res1 >> 32U);
    uint32_t lo = (uint32_t)res1;
    tmp[2U * i] = lo;
    tmp[2U * i + 1U] = hi;);
  uint32_t c1 = Hacl_Bignum_Addition_bn_add_eq_len_u32(16U, res, tmp, res);
  KRML_MAYBE_UNUSED_VAR(c1);
}